

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O1

void register_comport(list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *comList,
                     list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *comList8250,string *dir)

{
  size_t *psVar1;
  int iVar2;
  long *plVar3;
  _Node *p_Var4;
  size_type *psVar5;
  undefined1 local_88 [8];
  string driver;
  undefined1 local_58 [16];
  undefined1 local_48 [8];
  string devfile;
  
  get_driver((string *)local_88,dir);
  if (driver._M_dataplus._M_p != (pointer)0x0) {
    driver.field_2._8_8_ = local_58;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)((long)&driver.field_2 + 8),"/dev/","");
    basename((dir->_M_dataplus)._M_p);
    plVar3 = (long *)std::__cxx11::string::append(driver.field_2._M_local_buf + 8);
    psVar5 = (size_type *)(plVar3 + 2);
    if ((size_type *)*plVar3 == psVar5) {
      devfile._M_string_length = *psVar5;
      devfile.field_2._M_allocated_capacity = plVar3[3];
      local_48 = (undefined1  [8])&devfile._M_string_length;
    }
    else {
      devfile._M_string_length = *psVar5;
      local_48 = (undefined1  [8])*plVar3;
    }
    devfile._M_dataplus._M_p = (pointer)plVar3[1];
    *plVar3 = (long)psVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    if ((undefined1 *)driver.field_2._8_8_ != local_58) {
      operator_delete((void *)driver.field_2._8_8_);
    }
    iVar2 = std::__cxx11::string::compare(local_88);
    if (iVar2 == 0) {
      p_Var4 = std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
               _M_create_node<std::__cxx11::string_const&>
                         ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                          comList8250,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_48);
      std::__detail::_List_node_base::_M_hook(&p_Var4->super__List_node_base);
      comList = comList8250;
    }
    else {
      p_Var4 = std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
               _M_create_node<std::__cxx11::string_const&>
                         ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)comList
                          ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_48);
      std::__detail::_List_node_base::_M_hook(&p_Var4->super__List_node_base);
    }
    psVar1 = &(comList->
              super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
    if (local_48 != (undefined1  [8])&devfile._M_string_length) {
      operator_delete((void *)local_48);
    }
  }
  if (local_88 != (undefined1  [8])&driver._M_string_length) {
    operator_delete((void *)local_88);
  }
  return;
}

Assistant:

void register_comport( list<string>& comList, list<string>& comList8250, const string& dir) {
    // Get the driver the device is using
    string driver = get_driver(dir);

    // Skip devices without a driver
    if (driver.size() > 0) {
        string devfile = string("/dev/") + basename(dir.c_str());

        // Put serial8250-devices in a seperate list
        if (driver == "serial8250") {
            comList8250.push_back(devfile);
        } else
            comList.push_back(devfile);
    }
}